

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtransaction.cpp
# Opt level: O2

void __thiscall
ConfidentialTransaction_GetPegoutPubkeyDataPkhNoCounterTest_Test::TestBody
          (ConfidentialTransaction_GetPegoutPubkeyDataPkhNoCounterTest_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_2f0;
  AssertionResult gtest_ar;
  PegoutKeyData local_2d8;
  ByteData whitelist;
  Pubkey online_pubkey;
  GetPegoutPubkeyDataTestVector testdata;
  PegoutKeyData key_data;
  ByteData pubkey_prefix;
  string bitcoin_descriptor;
  Privkey master_online_key;
  Address addr;
  
  std::__cxx11::string::string
            ((string *)&addr,"02a71e193ce21075d0966be16724e41fff666366d7ac13e3616a329005da4024da",
             (allocator *)&testdata);
  cfd::core::Pubkey::Pubkey(&online_pubkey,(string *)&addr);
  std::__cxx11::string::~string((string *)&addr);
  std::__cxx11::string::string
            ((string *)&addr,"cPoefvB147bYpWCf9JqRBVMXENt4isSBAn91RYeiBh1jUp3ThhKN",
             (allocator *)&testdata);
  cfd::core::Privkey::FromWif(&master_online_key,(string *)&addr,kTestnet,true);
  std::__cxx11::string::~string((string *)&addr);
  std::__cxx11::string::string
            ((string *)&bitcoin_descriptor,
             "tpubDBwZbsX7C1m4tfHxHSFBvvuasqMxzMvSNM5yuAWz6kAfCATAgegvrtGdnxkqfr8wwRZi5d9fJHXqE8EFTSogTXd3xVx3GUFy9Xcg8dufREz"
             ,(allocator *)&addr);
  std::__cxx11::string::string
            ((string *)&addr,
             "020061b08c4c80dc04aaa0b44018d2c4bcdb0d9c0992fb4fddf9d2fb096a5164c002a71e193ce21075d0966be16724e41fff666366d7ac13e3616a329005da4024da"
             ,(allocator *)&testdata);
  cfd::core::ByteData::ByteData(&whitelist,(string *)&addr);
  std::__cxx11::string::~string((string *)&addr);
  std::__cxx11::string::string((string *)&addr,"043587cf",(allocator *)&testdata);
  cfd::core::ByteData::ByteData(&pubkey_prefix,(string *)&addr);
  std::__cxx11::string::~string((string *)&addr);
  cfd::core::PegoutKeyData::PegoutKeyData(&key_data);
  cfd::core::Address::Address(&addr);
  std::__cxx11::string::string
            ((string *)&testdata,
             "031edbc17e3c1e67bb7d4aaceede0b78e5b4bd69d1b38b1a7048f605d96f572ef1",
             (allocator *)&local_2d8);
  std::__cxx11::string::string
            ((string *)&testdata.whitelist_proof,
             "01cac9aebddceb0cc8e869f43d080ab00895ce89c3127c85ffd221152c52d912134d7d3da862e36b66c63f39bb4e1920bcd74013ec9a97e3374678113251f6a12d"
             ,(allocator *)&gtest_ar);
  std::__cxx11::string::string
            ((string *)&testdata.address,"mx7egZtzUWR8aVviQnpKJCoaT4ytSiQjxL",
             (allocator *)&local_2f0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ConfidentialTransaction::GetPegoutPubkeyData
                (&local_2d8,&online_pubkey,&master_online_key,&bitcoin_descriptor,0,&whitelist,
                 kTestnet,&pubkey_prefix,kElementsRegtest,&addr);
      cfd::core::PegoutKeyData::operator=(&key_data,&local_2d8);
      cfd::core::PegoutKeyData::~PegoutKeyData(&local_2d8);
    }
  }
  else {
    testing::Message::Message((Message *)&local_2d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x7b5,
               "Expected: (key_data = ConfidentialTransaction::GetPegoutPubkeyData( online_pubkey, master_online_key, bitcoin_descriptor, bip32_counter, whitelist, net_type, pubkey_prefix, NetType::kElementsRegtest, &addr)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_2d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_2d8);
  }
  cfd::core::Pubkey::GetHex_abi_cxx11_((string *)&local_2d8,&key_data.btc_pubkey_bytes);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"key_data.btc_pubkey_bytes.GetHex().c_str()",
             "testdata.btc_pubkey_bytes.c_str()",
             (char *)local_2d8.btc_pubkey_bytes.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start,testdata.btc_pubkey_bytes._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_2d8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_2d8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x7b8,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2f0,(Message *)&local_2d8);
    testing::internal::AssertHelper::~AssertHelper(&local_2f0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_2d8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)&local_2d8,&key_data.whitelist_proof);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"key_data.whitelist_proof.GetHex().c_str()",
             "testdata.whitelist_proof.c_str()",
             (char *)local_2d8.btc_pubkey_bytes.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start,testdata.whitelist_proof._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_2d8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_2d8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x7bb,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2f0,(Message *)&local_2d8);
    testing::internal::AssertHelper::~AssertHelper(&local_2f0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_2d8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::Address::GetAddress_abi_cxx11_((string *)&local_2d8,&addr);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"addr.GetAddress().c_str()","testdata.address.c_str()",
             (char *)local_2d8.btc_pubkey_bytes.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start,testdata.address._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_2d8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_2d8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x7be,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2f0,(Message *)&local_2d8);
    testing::internal::AssertHelper::~AssertHelper(&local_2f0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_2d8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  GetPegoutPubkeyDataTestVector::~GetPegoutPubkeyDataTestVector(&testdata);
  cfd::core::Address::~Address(&addr);
  cfd::core::PegoutKeyData::~PegoutKeyData(&key_data);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pubkey_prefix);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&whitelist);
  std::__cxx11::string::~string((string *)&bitcoin_descriptor);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&master_online_key);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&online_pubkey);
  return;
}

Assistant:

TEST(ConfidentialTransaction, GetPegoutPubkeyDataPkhNoCounterTest) {
  // liquid_pak
  Pubkey online_pubkey("02a71e193ce21075d0966be16724e41fff666366d7ac13e3616a329005da4024da");
  // liquid_pak_privkey
  Privkey master_online_key = Privkey::FromWif(
      "cPoefvB147bYpWCf9JqRBVMXENt4isSBAn91RYeiBh1jUp3ThhKN", NetType::kTestnet, true);
  std::string bitcoin_descriptor = "tpubDBwZbsX7C1m4tfHxHSFBvvuasqMxzMvSNM5yuAWz6kAfCATAgegvrtGdnxkqfr8wwRZi5d9fJHXqE8EFTSogTXd3xVx3GUFy9Xcg8dufREz";
  ByteData whitelist("020061b08c4c80dc04aaa0b44018d2c4bcdb0d9c0992fb4fddf9d2fb096a5164c002a71e193ce21075d0966be16724e41fff666366d7ac13e3616a329005da4024da");
  NetType net_type = NetType::kTestnet;
  ByteData pubkey_prefix = ByteData("043587cf");
  uint32_t bip32_counter = 0;
  PegoutKeyData key_data;

  Address addr;
  // 20200625: Although the logic is the same, a problem occurred due to the processing position.
  GetPegoutPubkeyDataTestVector testdata = {
    "031edbc17e3c1e67bb7d4aaceede0b78e5b4bd69d1b38b1a7048f605d96f572ef1",
    "01cac9aebddceb0cc8e869f43d080ab00895ce89c3127c85ffd221152c52d912134d7d3da862e36b66c63f39bb4e1920bcd74013ec9a97e3374678113251f6a12d",
    "mx7egZtzUWR8aVviQnpKJCoaT4ytSiQjxL"
  };
  EXPECT_NO_THROW(
    (key_data = ConfidentialTransaction::GetPegoutPubkeyData(
        online_pubkey, master_online_key, bitcoin_descriptor, bip32_counter,
        whitelist, net_type, pubkey_prefix, NetType::kElementsRegtest, &addr)));
  EXPECT_STREQ(
      key_data.btc_pubkey_bytes.GetHex().c_str(),
      testdata.btc_pubkey_bytes.c_str());
  EXPECT_STREQ(
      key_data.whitelist_proof.GetHex().c_str(),
      testdata.whitelist_proof.c_str());
  EXPECT_STREQ(
      addr.GetAddress().c_str(),
      testdata.address.c_str());
}